

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 in_register_00000034;
  undefined1 auVar4 [16];
  
  auVar4._8_8_ = __addr;
  auVar4._0_8_ = in_RAX;
  iVar3 = (int)in_RAX;
  for (puVar1 = *(undefined8 **)(CONCAT44(in_register_00000034,__fd) + 0x48);
      puVar1 != (undefined8 *)(CONCAT44(in_register_00000034,__fd) + 0x48);
      puVar1 = (undefined8 *)*puVar1) {
    plVar2 = (long *)puVar1[2];
    if (plVar2 == (long *)0x0) {
      this->result_ = (Value *)0x0;
    }
    else {
      auVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,this,auVar4._8_8_);
    }
    iVar3 = auVar4._0_4_;
  }
  return iVar3;
}

Assistant:

void IRGenerator::accept(CompoundStmt& compoundStmt) {
  for (const auto& stmt : compoundStmt) {
    codegen(stmt.get());
  }
}